

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlCtxtReadFd(xmlParserCtxtPtr ctxt,int fd,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  xmlParserInputBufferPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int fd_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (fd < 0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    xmlInitParser();
    xmlCtxtReset(ctxt);
    input_00 = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      input_00->closecallback = (xmlInputCloseCallback)0x0;
      value = xmlNewIOInputStream(ctxt,input_00,XML_CHAR_ENCODING_NONE);
      if (value == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        inputPush(ctxt,value);
        ctxt_local = (xmlParserCtxtPtr)xmlDoRead(ctxt,URL,encoding,options,1);
      }
    }
  }
  return (xmlDocPtr)ctxt_local;
}

Assistant:

xmlDocPtr
xmlCtxtReadFd(xmlParserCtxtPtr ctxt, int fd,
              const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (fd < 0)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    xmlCtxtReset(ctxt);


    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (NULL);
    input->closecallback = NULL;
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, URL, encoding, options, 1));
}